

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,String *first,ArrayPtr<const_char> *rest,
          CappedArray<char,_14UL> *rest_1,ArrayPtr<const_char> *rest_2,ArrayPtr<const_char> *rest_3,
          ArrayPtr<const_char> *rest_4,StringTree *rest_5,StringTree *rest_6,
          ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,ArrayPtr<const_char> *rest_12,
          String *rest_13,ArrayPtr<const_char> *rest_14,ArrayPtr<const_char> *rest_15,
          ArrayPtr<const_char> *rest_16,String *rest_17,ArrayPtr<const_char> *rest_18,
          CappedArray<char,_14UL> *rest_19,ArrayPtr<const_char> *rest_20,StringTree *rest_21,
          StringTree *rest_22,StringTree *rest_23,StringTree *rest_24,ArrayPtr<const_char> *rest_25,
          ArrayPtr<const_char> *rest_26,ArrayPtr<const_char> *rest_27,ArrayPtr<const_char> *rest_28,
          ArrayPtr<const_char> *rest_29,ArrayPtr<const_char> *rest_30,String *rest_31,
          ArrayPtr<const_char> *rest_32,ArrayPtr<const_char> *rest_33,ArrayPtr<const_char> *rest_34,
          String *rest_35,ArrayPtr<const_char> *rest_36,CappedArray<char,_14UL> *rest_37,
          ArrayPtr<const_char> *rest_38,StringTree *rest_39,StringTree *rest_40,
          ArrayPtr<const_char> *rest_41,ArrayPtr<const_char> *rest_42,String *rest_43,
          ArrayPtr<const_char> *rest_44,ArrayPtr<const_char> *rest_45,ArrayPtr<const_char> *rest_46,
          ArrayPtr<const_char> *rest_47,ArrayPtr<const_char> *rest_48,ArrayPtr<const_char> *rest_49,
          ArrayPtr<const_char> *rest_50,String *rest_51,ArrayPtr<const_char> *rest_52,
          CappedArray<char,_14UL> *rest_53,ArrayPtr<const_char> *rest_54,StringTree *rest_55,
          StringTree *rest_56,ArrayPtr<const_char> *rest_57)

{
  Array<char> *pAVar1;
  size_t pos_00;
  char *pcVar2;
  Branch *pBVar3;
  String *pSVar4;
  ArrayPtr<const_char> *first_00;
  CappedArray<char,_14UL> *rest_58;
  ArrayPtr<const_char> *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  StringTree *rest_4_00;
  StringTree *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  ArrayPtr<const_char> *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  ArrayPtr<const_char> *rest_9_00;
  ArrayPtr<const_char> *rest_10_00;
  ArrayPtr<const_char> *rest_11_00;
  ArrayPtr<const_char> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  String *rest_16_00;
  ArrayPtr<const_char> *rest_17_00;
  CappedArray<char,_14UL> *rest_18_00;
  ArrayPtr<const_char> *rest_19_00;
  StringTree *rest_20_00;
  StringTree *rest_21_00;
  StringTree *rest_22_00;
  StringTree *rest_23_00;
  ArrayPtr<const_char> *rest_24_00;
  ArrayPtr<const_char> *rest_25_00;
  ArrayPtr<const_char> *rest_26_00;
  ArrayPtr<const_char> *rest_27_00;
  ArrayPtr<const_char> *rest_28_00;
  ArrayPtr<const_char> *rest_29_00;
  String *rest_30_00;
  ArrayPtr<const_char> *rest_31_00;
  ArrayPtr<const_char> *rest_32_00;
  ArrayPtr<const_char> *rest_33_00;
  String *rest_34_00;
  ArrayPtr<const_char> *rest_35_00;
  CappedArray<char,_14UL> *rest_36_00;
  ArrayPtr<const_char> *rest_37_00;
  StringTree *rest_38_00;
  StringTree *rest_39_00;
  ArrayPtr<const_char> *rest_40_00;
  ArrayPtr<const_char> *rest_41_00;
  String *rest_42_00;
  ArrayPtr<const_char> *rest_43_00;
  ArrayPtr<const_char> *rest_44_00;
  ArrayPtr<const_char> *rest_45_00;
  ArrayPtr<const_char> *rest_46_00;
  ArrayPtr<const_char> *rest_47_00;
  ArrayPtr<const_char> *rest_48_00;
  ArrayPtr<const_char> *rest_49_00;
  String *rest_50_00;
  ArrayPtr<const_char> *rest_51_00;
  CappedArray<char,_14UL> *rest_52_00;
  ArrayPtr<const_char> *rest_53_00;
  StringTree *rest_54_00;
  StringTree *rest_55_00;
  ArrayPtr<const_char> *rest_56_00;
  StringTree local_98;
  CappedArray<char,_14UL> *local_60;
  CappedArray<char,_14UL> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  String *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  local_60 = rest_1;
  rest_local_1 = (CappedArray<char,_14UL> *)rest;
  rest_local = (ArrayPtr<const_char> *)first;
  first_local = (String *)branchIndex;
  branchIndex_local = (size_t)pos;
  pos_local = (char *)this;
  pcVar2 = String::begin(&this->text);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  pBVar3->index = (long)pos - (long)pcVar2;
  pSVar4 = mv<kj::String>((String *)rest_local);
  StringTree(&local_98,pSVar4);
  pBVar3 = Array<kj::StringTree::Branch>::operator[](&this->branches,(size_t)first_local);
  operator=(&pBVar3->content,&local_98);
  ~StringTree(&local_98);
  pos_00 = branchIndex_local;
  pAVar1 = &first_local->content;
  first_00 = fwd<kj::ArrayPtr<char_const>>((NoInfer<kj::ArrayPtr<const_char>_> *)rest_local_1);
  rest_58 = fwd<kj::CappedArray<char,14ul>>(local_60);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::StringTree>(rest_5);
  rest_5_00 = fwd<kj::StringTree>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  rest_10_00 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  rest_11_00 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pSVar4 = fwd<kj::String>(rest_13);
  rest_13_00 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  rest_16_00 = fwd<kj::String>(rest_17);
  rest_17_00 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  rest_18_00 = fwd<kj::CappedArray<char,14ul>>(rest_19);
  rest_19_00 = fwd<kj::ArrayPtr<char_const>>(rest_20);
  rest_20_00 = fwd<kj::StringTree>(rest_21);
  rest_21_00 = fwd<kj::StringTree>(rest_22);
  rest_22_00 = fwd<kj::StringTree>(rest_23);
  rest_23_00 = fwd<kj::StringTree>(rest_24);
  rest_24_00 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  rest_25_00 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  rest_26_00 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  rest_27_00 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  rest_28_00 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  rest_29_00 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  rest_30_00 = fwd<kj::String>(rest_31);
  rest_31_00 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  rest_32_00 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  rest_33_00 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  rest_34_00 = fwd<kj::String>(rest_35);
  rest_35_00 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  rest_36_00 = fwd<kj::CappedArray<char,14ul>>(rest_37);
  rest_37_00 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  rest_38_00 = fwd<kj::StringTree>(rest_39);
  rest_39_00 = fwd<kj::StringTree>(rest_40);
  rest_40_00 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  rest_41_00 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  rest_42_00 = fwd<kj::String>(rest_43);
  rest_43_00 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  rest_44_00 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  rest_45_00 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  rest_46_00 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  rest_47_00 = fwd<kj::ArrayPtr<char_const>>(rest_48);
  rest_48_00 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  rest_49_00 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  rest_50_00 = fwd<kj::String>(rest_51);
  rest_51_00 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  rest_52_00 = fwd<kj::CappedArray<char,14ul>>(rest_53);
  rest_53_00 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  rest_54_00 = fwd<kj::StringTree>(rest_55);
  rest_55_00 = fwd<kj::StringTree>(rest_56);
  rest_56_00 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,(char *)pos_00,(size_t)((long)&pAVar1->ptr + 1),first_00,rest_58,rest_1_00,
             rest_2_00,rest_3_00,rest_4_00,rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,
             rest_10_00,rest_11_00,pSVar4,rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00,
             rest_18_00,rest_19_00,rest_20_00,rest_21_00,rest_22_00,rest_23_00,rest_24_00,rest_25_00
             ,rest_26_00,rest_27_00,rest_28_00,rest_29_00,rest_30_00,rest_31_00,rest_32_00,
             rest_33_00,rest_34_00,rest_35_00,rest_36_00,rest_37_00,rest_38_00,rest_39_00,rest_40_00
             ,rest_41_00,rest_42_00,rest_43_00,rest_44_00,rest_45_00,rest_46_00,rest_47_00,
             rest_48_00,rest_49_00,rest_50_00,rest_51_00,rest_52_00,rest_53_00,rest_54_00,rest_55_00
             ,rest_56_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, String&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = StringTree(kj::mv(first));
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}